

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void __thiscall Connection::~Connection(Connection *this)

{
  pointer pcVar1;
  
  if (this->connected == true) {
    close(this->client_socket_);
    close(this->forwarding_socket_);
    this->connected = false;
  }
  pcVar1 = (this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Connection::~Connection() {
    if (connected) {
        disconnect();
    }
}